

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall cmCTest::GetBinaryDir_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  cmCTest *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->BinaryDir);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetBinaryDir()
{
  return this->BinaryDir;
}